

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_json_encode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  SyBlob sBlob;
  SyBlob local_48;
  json_private_data local_28;
  
  local_28.pOut = &local_48;
  if (nArg < 1) {
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    (pObj->x).rVal = 0.0;
    pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  }
  else {
    local_48.pAllocator = &pCtx->pVm->sAllocator;
    local_48.pBlob = (char *)0x0;
    local_48.nByte = 0;
    local_48.mByte = 0;
    local_48.nFlags = 0;
    local_28.nRecCount = 0;
    local_28.isFirst = 1;
    local_28.iFlags = 0;
    VmJsonEncode(*apArg,&local_28);
    jx9_value_string(pCtx->pRet,(char *)local_48.pBlob,local_48.nByte);
    if (((local_48.nFlags & 6) == 0) && (local_48.mByte != 0)) {
      SyMemBackendFree(local_48.pAllocator,local_48.pBlob);
    }
  }
  return 0;
}

Assistant:

static int vm_builtin_json_encode(jx9_context *pCtx,int nArg,jx9_value **apArg)
{
	SyBlob sBlob;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Init the working buffer */
	SyBlobInit(&sBlob,&pCtx->pVm->sAllocator);
	/* Perform the encoding operation */
	jx9JsonSerialize(apArg[0],&sBlob);
	/* Return the serialized value */
	jx9_result_string(pCtx,(const char *)SyBlobData(&sBlob),(int)SyBlobLength(&sBlob));
	/* Cleanup */
	SyBlobRelease(&sBlob);
	/* All done */
	return JX9_OK;
}